

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O3

ztast_intarrayinner_t *
ztast_intarrayinner_append(ztast_t *ast,ztast_intarrayinner_t *inner,int val)

{
  int iVar1;
  int iVar2;
  uint *__dest;
  ulong uVar3;
  
  if (inner == (ztast_intarrayinner_t *)0x0) {
    inner = (ztast_intarrayinner_t *)(*ast->mallocfn)(0x10,ast->opaque);
    if (inner != (ztast_intarrayinner_t *)0x0) {
      inner->nused = 0;
      inner->nallocated = 0;
      inner->ints = (uint *)0x0;
      uVar3 = 8;
      goto LAB_00102915;
    }
LAB_0010295f:
    inner = (ztast_intarrayinner_t *)0x0;
  }
  else {
    iVar2 = inner->nused;
    iVar1 = inner->nallocated;
    if (iVar2 == iVar1) {
      uVar3 = 8;
      if (7 < iVar1) {
        uVar3 = (ulong)(uint)(iVar1 * 2);
      }
LAB_00102915:
      __dest = (uint *)(*ast->mallocfn)(uVar3 << 2,ast->opaque);
      if (__dest == (uint *)0x0) goto LAB_0010295f;
      memcpy(__dest,inner->ints,(long)inner->nallocated << 2);
      if (ast->freefn != (ztast_freefn_t *)0x0) {
        (*ast->freefn)(inner->ints,ast->opaque);
      }
      inner->nallocated = (int)uVar3;
      inner->ints = __dest;
      iVar2 = inner->nused;
    }
    else {
      __dest = inner->ints;
    }
    inner->nused = iVar2 + 1;
    __dest[iVar2] = val;
  }
  return inner;
}

Assistant:

ztast_intarrayinner_t *ztast_intarrayinner_append(ztast_t               *ast,
                                                  ztast_intarrayinner_t *inner,
                                                  int                    val)
{
  assert(ast);
  /* inner may be NULL - which means allocate */

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_intarrayinner_append\n");
#endif

  if (inner == NULL)
  {
    inner = ZTAST_MALLOC(sizeof(*inner));
    if (inner == NULL)
      return NULL;

    inner->nused      = 0;
    inner->nallocated = 0;
    inner->ints       = NULL;
  }

  if (inner->nused == inner->nallocated)
  {
    int           newarrlen;
    unsigned int *newarr;

    /* This code pattern would use realloc() normally but our simple memory
     * manager doesn't currently feature it. */

    newarrlen = inner->nallocated < 8 ? 8 : inner->nallocated * 2;
    newarr = ZTAST_MALLOC(newarrlen * sizeof(*newarr));
    if (newarr == NULL)
      return NULL;

    memcpy(newarr, inner->ints, inner->nallocated * sizeof(*newarr));
    ZTAST_FREE(inner->ints);

    inner->nallocated = newarrlen;
    inner->ints       = newarr;
  }

  inner->ints[inner->nused++] = val;

  return inner;
}